

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O0

shared_ptr<simple_thread_pool::TaskHandle> __thiscall
simple_thread_pool::ThreadPoolMgr::getTaskToRun
          (ThreadPoolMgr *this,uint64_t *next_sleep_hint_us_inout)

{
  bool bVar1;
  element_type *this_00;
  size_type sVar2;
  unsigned_long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<simple_thread_pool::TaskHandle> sVar4;
  iterator entry_1;
  lock_guard<std::mutex> l_1;
  uint64_t remaining_us;
  shared_ptr<simple_thread_pool::TaskHandle> *tt;
  iterator entry;
  lock_guard<std::mutex> l;
  shared_ptr<simple_thread_pool::TaskHandle> *task_to_run;
  mutex_type *in_stack_ffffffffffffff18;
  list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
  *in_stack_ffffffffffffff20;
  const_iterator in_stack_ffffffffffffff28;
  TaskHandle *in_stack_ffffffffffffff30;
  _List_const_iterator<std::shared_ptr<simple_thread_pool::TaskHandle>_> in_stack_ffffffffffffff70;
  _Self in_stack_ffffffffffffff78;
  _Self local_80 [2];
  _List_node_base *local_70;
  _List_const_iterator<std::shared_ptr<simple_thread_pool::TaskHandle>_> local_68;
  _List_node_base *local_60;
  unsigned_long local_58;
  reference local_50;
  _Self local_48;
  _Self local_40 [4];
  undefined1 local_19;
  unsigned_long *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::shared_ptr<simple_thread_pool::TaskHandle>::shared_ptr
            ((shared_ptr<simple_thread_pool::TaskHandle> *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  local_40[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
       ::begin((list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
                *)in_stack_ffffffffffffff18);
  while( true ) {
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
         ::end((list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
                *)in_stack_ffffffffffffff18);
    bVar1 = std::operator!=(local_40,&local_48);
    if (!bVar1) break;
    local_50 = std::_List_iterator<std::shared_ptr<simple_thread_pool::TaskHandle>_>::operator*
                         ((_List_iterator<std::shared_ptr<simple_thread_pool::TaskHandle>_> *)
                          in_stack_ffffffffffffff20);
    local_58 = 0;
    std::
    __shared_ptr_access<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x10be03);
    bVar1 = TaskHandle::timeToFire
                      ((TaskHandle *)in_stack_ffffffffffffff78._M_node,
                       (uint64_t *)in_stack_ffffffffffffff70._M_node);
    if (bVar1) {
      std::shared_ptr<simple_thread_pool::TaskHandle>::operator=
                ((shared_ptr<simple_thread_pool::TaskHandle> *)in_stack_ffffffffffffff20,
                 (shared_ptr<simple_thread_pool::TaskHandle> *)in_stack_ffffffffffffff18);
      this_00 = std::
                __shared_ptr_access<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x10be42);
      bVar1 = TaskHandle::isOneTime(this_00);
      if (bVar1) {
LAB_0010be7f:
        std::_List_const_iterator<std::shared_ptr<simple_thread_pool::TaskHandle>_>::
        _List_const_iterator(&local_68,local_40);
        local_60 = (_List_node_base *)
                   std::__cxx11::
                   list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
                   ::erase(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
        local_40[0]._M_node = local_60;
      }
      else {
        std::
        __shared_ptr_access<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x10be64);
        bVar1 = TaskHandle::isDone((TaskHandle *)0x10be6c);
        if (bVar1) goto LAB_0010be7f;
        std::
        __shared_ptr_access<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x10bf19);
        TaskHandle::reschedule(in_stack_ffffffffffffff30,(int64_t)in_stack_ffffffffffffff28._M_node)
        ;
      }
      std::
      __shared_ptr_access<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x10bf36);
      bVar1 = TaskHandle::isDone((TaskHandle *)0x10bf3e);
      if (!bVar1) break;
      std::__shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2> *)
                 in_stack_ffffffffffffff30);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
    if ((!bVar1) &&
       (local_70 = (_List_node_base *)
                   std::_List_iterator<std::shared_ptr<simple_thread_pool::TaskHandle>_>::operator++
                             (local_40,0), local_18 != (unsigned_long *)0x0)) {
      in_stack_ffffffffffffff30 = (TaskHandle *)std::min<unsigned_long>(local_18,&local_58);
      *local_18 = *(unsigned_long *)in_stack_ffffffffffffff30;
      in_stack_ffffffffffffff28._M_node =
           (_List_node_base *)std::min<unsigned_long>(local_18,(unsigned_long *)(in_RSI + 8));
      *local_18 = (unsigned_long)(in_stack_ffffffffffffff28._M_node)->_M_next;
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10c005);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
  _Var3._M_pi = extraout_RDX;
  if (!bVar1) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    local_80[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
         ::begin((list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
                  *)in_stack_ffffffffffffff18);
    std::__cxx11::
    list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
    ::end((list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
           *)in_stack_ffffffffffffff18);
    bVar1 = std::operator!=(local_80,(_Self *)&stack0xffffffffffffff78);
    if (bVar1) {
      std::_List_iterator<std::shared_ptr<simple_thread_pool::TaskHandle>_>::operator*
                ((_List_iterator<std::shared_ptr<simple_thread_pool::TaskHandle>_> *)
                 in_stack_ffffffffffffff20);
      std::shared_ptr<simple_thread_pool::TaskHandle>::operator=
                ((shared_ptr<simple_thread_pool::TaskHandle> *)in_stack_ffffffffffffff20,
                 (shared_ptr<simple_thread_pool::TaskHandle> *)in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff20 =
           (list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
            *)(in_RSI + 0xe0);
      std::_List_const_iterator<std::shared_ptr<simple_thread_pool::TaskHandle>_>::
      _List_const_iterator
                ((_List_const_iterator<std::shared_ptr<simple_thread_pool::TaskHandle>_> *)
                 &stack0xffffffffffffff70,local_80);
      std::__cxx11::
      list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
      ::erase(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
    }
    sVar2 = std::__cxx11::
            list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
            ::size(in_stack_ffffffffffffff20);
    if ((sVar2 != 0) && (local_18 != (unsigned_long *)0x0)) {
      *local_18 = 0;
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10c0f7);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<simple_thread_pool::TaskHandle>)
         sVar4.super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TaskHandle> getTaskToRun
                                (uint64_t* next_sleep_hint_us_inout = nullptr)
    {
        // Check timer task first (higher priority).
        std::shared_ptr<TaskHandle> task_to_run = nullptr;
        {   std::lock_guard<std::mutex> l(timedTasksLock);
            auto entry = timedTasks.begin();
            while (entry != timedTasks.end()) {
                std::shared_ptr<TaskHandle>& tt = *entry;
                uint64_t remaining_us = 0;
                if (tt->timeToFire(remaining_us)) {
                    task_to_run = tt;
                    if ( task_to_run->isOneTime() ||
                         task_to_run->isDone() ) {
                        entry = timedTasks.erase(entry);
                    } else {
                        task_to_run->reschedule();
                    }

                    if (task_to_run->isDone()) task_to_run.reset();
                    else break;
                }
                if (!task_to_run) {
                    entry++;
                    // Adjust next sleep time.
                    if (next_sleep_hint_us_inout) {
                        *next_sleep_hint_us_inout = std::min(*next_sleep_hint_us_inout,
                                                             remaining_us);
                        *next_sleep_hint_us_inout = std::min(*next_sleep_hint_us_inout,
                                                             MAX_SLEEP_US);
                    }
                }
            }
        }

        if (!task_to_run) {
            // If there is no timer task to be fired for now,
            // pick a normal task.
            std::lock_guard<std::mutex> l(normalTasksLock);
            auto entry = normalTasks.begin();
            if (entry != normalTasks.end()) {
                task_to_run = *entry;
                normalTasks.erase(entry);
            }

            if (normalTasks.size()) {
                // Still have pending task(s). Do not sleep.
                if (next_sleep_hint_us_inout) {
                    *next_sleep_hint_us_inout = 0;
                }
            }
        }
        return task_to_run;
    }